

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_aliasingUnits_Test::~Units_aliasingUnits_Test(Units_aliasingUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, aliasingUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("per_hour");
    u1->addUnit("mm");
    libcellml::UnitsPtr u2 = libcellml::Units::create("mm");
    u2->addUnit("second", "milli");

    libcellml::ModelPtr model = libcellml::Model::create("containing_model");

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}